

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall
re2::Regexp::ParseState::ParseCCRange
          (ParseState *this,StringPiece *s,RuneRange *rr,StringPiece *whole_class,
          RegexpStatus *status)

{
  const_pointer pcVar1;
  char *pcVar2;
  const_pointer pcVar3;
  bool bVar4;
  
  pcVar1 = s->data_;
  bVar4 = ParseCCCharacter(this,s,&rr->lo,whole_class,status);
  if (bVar4) {
    if (((s->size_ < 2) || (pcVar2 = s->data_, *pcVar2 != '-')) || (pcVar2[1] == ']')) {
      rr->hi = rr->lo;
      return true;
    }
    s->data_ = pcVar2 + 1;
    s->size_ = s->size_ - 1;
    bVar4 = ParseCCCharacter(this,s,&rr->hi,whole_class,status);
    if (bVar4) {
      if (rr->lo <= rr->hi) {
        return true;
      }
      status->code_ = kRegexpBadCharRange;
      pcVar3 = s->data_;
      (status->error_arg_).data_ = pcVar1;
      (status->error_arg_).size_ = (long)pcVar3 - (long)pcVar1;
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCCRange(StringPiece* s, RuneRange* rr,
                                      const StringPiece& whole_class,
                                      RegexpStatus* status) {
  StringPiece os = *s;
  if (!ParseCCCharacter(s, &rr->lo, whole_class, status))
    return false;
  // [a-] means (a|-), so check for final ].
  if (s->size() >= 2 && (*s)[0] == '-' && (*s)[1] != ']') {
    s->remove_prefix(1);  // '-'
    if (!ParseCCCharacter(s, &rr->hi, whole_class, status))
      return false;
    if (rr->hi < rr->lo) {
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(
          StringPiece(os.data(), static_cast<size_t>(s->data() - os.data())));
      return false;
    }
  } else {
    rr->hi = rr->lo;
  }
  return true;
}